

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_sql_purify_len(char *p)

{
  char cVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    cVar1 = *p;
    if (cVar1 == '\0') break;
    p = p + 1;
    iVar2 = iVar2 + (uint)(cVar1 == '\'') + 1;
  }
  return iVar2;
}

Assistant:

int
lws_sql_purify_len(const char *p)
{
	int olen = 0;

	while (*p) {
		if (*p++ == '\'')
			olen++;
		olen++;
	}

	return olen;
}